

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O2

void Assimp::IFC::FindAdjacentContours(iterator current,ContourVector *contours)

{
  double *pdVar1;
  pointer pPVar2;
  pointer paVar3;
  bool bVar4;
  ulong uVar5;
  ulong __n;
  pointer pPVar6;
  ulong uVar7;
  long lVar8;
  reference rVar9;
  const_iterator __position;
  const_iterator __position_00;
  bool local_b1;
  SkipList *local_b0;
  IfcVector2 isect1;
  IfcVector2 isect0;
  IfcVector2 n1;
  IfcVector2 n0;
  IfcVector2 m1;
  IfcVector2 m0;
  
  local_b0 = &(current._M_current)->skiplist;
  pPVar6 = (contours->
           super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pPVar2 = (contours->
           super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pPVar6 == pPVar2) {
      return;
    }
    if ((pPVar6->contour).
        super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (pPVar6->contour).
        super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      if (pPVar6 != current._M_current) {
        bVar4 = BoundingBoxesOverlapping(&(current._M_current)->bb,&pPVar6->bb);
        if (bVar4) {
          __assert_fail("is_me || !BoundingBoxesOverlapping(bb, ibb)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCOpenings.cpp"
                        ,0x2c6,
                        "void Assimp::IFC::FindAdjacentContours(ContourVector::iterator, const ContourVector &)"
                       );
        }
        bVar4 = BoundingBoxesAdjacent(&(current._M_current)->bb,&pPVar6->bb);
        if (!bVar4) goto LAB_004df3ef;
      }
      __n = 0;
      while( true ) {
        paVar3 = ((current._M_current)->contour).
                 super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar5 = (long)((current._M_current)->contour).
                      super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)paVar3 >> 4;
        if (uVar5 <= __n) break;
        uVar7 = 0;
        if (__n + 1 != uVar5) {
          uVar7 = __n + 1;
        }
        n0.x = paVar3[__n].x;
        n0.y = paVar3[__n].y;
        n1.x = paVar3[uVar7].x;
        n1.y = paVar3[uVar7].y;
        uVar5 = __n;
        if (pPVar6 != current._M_current) {
          uVar5 = (long)(pPVar6->contour).
                        super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pPVar6->contour).
                        super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4;
        }
        lVar8 = 0;
        uVar7 = 0;
        while (uVar5 != uVar7) {
          if ((pPVar6 == current._M_current) && (__n <= uVar7)) {
            __assert_fail("&mcontour != &ncontour || m < n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCOpenings.cpp"
                          ,0x2d7,
                          "void Assimp::IFC::FindAdjacentContours(ContourVector::iterator, const ContourVector &)"
                         );
          }
          paVar3 = (pPVar6->contour).
                   super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pdVar1 = (double *)((long)&paVar3->x + lVar8);
          m0.x = *pdVar1;
          m0.y = pdVar1[1];
          uVar7 = uVar7 + 1;
          m1.x = paVar3[uVar7 % (ulong)((long)(pPVar6->contour).
                                              super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)paVar3 >> 4)].x;
          m1.y = paVar3[uVar7 % (ulong)((long)(pPVar6->contour).
                                              super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)paVar3 >> 4)].y;
          isect0.x = 0.0;
          isect0.y = 0.0;
          isect1.x = 0.0;
          isect1.y = 0.0;
          bVar4 = IntersectingLineSegments(&n0,&n1,&m0,&m1,&isect0,&isect1);
          if (bVar4) {
            if ((isect0.x - n0.x) * (isect0.x - n0.x) + (isect0.y - n0.y) * (isect0.y - n0.y) <=
                1.1920928955078125e-07) {
              rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[](local_b0,__n);
              *rVar9._M_p = *rVar9._M_p | rVar9._M_mask;
            }
            else {
              __n = __n + 1;
              std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::insert
                        (&(current._M_current)->contour,
                         ((current._M_current)->contour).
                         super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + __n,&isect0);
              __position.super__Bit_iterator_base._M_p =
                   ((current._M_current)->skiplist).super__Bvector_base<std::allocator<bool>_>.
                   _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                   (long)__n / 0x40 +
                   (ulong)((__n & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
              __position.super__Bit_iterator_base._M_offset = (uint)__n & 0x3f;
              local_b1 = true;
              __position.super__Bit_iterator_base._12_4_ = 0;
              std::vector<bool,_std::allocator<bool>_>::insert(local_b0,__position,&local_b1);
            }
            if (1.1920928955078125e-07 <
                (isect1.x - n1.x) * (isect1.x - n1.x) + (isect1.y - n1.y) * (isect1.y - n1.y)) {
              __n = __n + 1;
              std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::insert
                        (&(current._M_current)->contour,
                         ((current._M_current)->contour).
                         super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + __n,&isect1);
              __position_00.super__Bit_iterator_base._M_p =
                   ((current._M_current)->skiplist).super__Bvector_base<std::allocator<bool>_>.
                   _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                   (long)__n / 0x40 +
                   (ulong)((__n & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
              __position_00.super__Bit_iterator_base._M_offset = (uint)__n & 0x3f;
              local_b1 = false;
              __position_00.super__Bit_iterator_base._12_4_ = 0;
              std::vector<bool,_std::allocator<bool>_>::insert(local_b0,__position_00,&local_b1);
            }
          }
          lVar8 = lVar8 + 0x10;
        }
        __n = __n + 1;
      }
    }
LAB_004df3ef:
    pPVar6 = pPVar6 + 1;
  } while( true );
}

Assistant:

void FindAdjacentContours(ContourVector::iterator current, const ContourVector& contours)
{
    const IfcFloat sqlen_epsilon = static_cast<IfcFloat>(Math::getEpsilon<float>());
    const BoundingBox& bb = (*current).bb;

    // What is to be done here is to populate the skip lists for the contour
    // and to add necessary padding points when needed.
    SkipList& skiplist = (*current).skiplist;

    // First step to find possible adjacent contours is to check for adjacent bounding
    // boxes. If the bounding boxes are not adjacent, the contours lines cannot possibly be.
    for (ContourVector::const_iterator it = contours.begin(), end = contours.end(); it != end; ++it) {
        if ((*it).IsInvalid()) {
            continue;
        }

        // this left here to make clear we also run on the current contour
        // to check for overlapping contour segments (which can happen due
        // to projection artifacts).
        //if(it == current) {
        //  continue;
        //}

        const bool is_me = it == current;

        const BoundingBox& ibb = (*it).bb;

        // Assumption: the bounding boxes are pairwise disjoint or identical
        ai_assert(is_me || !BoundingBoxesOverlapping(bb, ibb));

        if (is_me || BoundingBoxesAdjacent(bb, ibb)) {

            // Now do a each-against-everyone check for intersecting contour
            // lines. This obviously scales terribly, but in typical real
            // world Ifc files it will not matter since most windows that
            // are adjacent to each others are rectangular anyway.

            Contour& ncontour = (*current).contour;
            const Contour& mcontour = (*it).contour;

            for (size_t n = 0; n < ncontour.size(); ++n) {
                const IfcVector2 n0 = ncontour[n];
                const IfcVector2 n1 = ncontour[(n+1) % ncontour.size()];

                for (size_t m = 0, mend = (is_me ? n : mcontour.size()); m < mend; ++m) {
                    ai_assert(&mcontour != &ncontour || m < n);

                    const IfcVector2 m0 = mcontour[m];
                    const IfcVector2 m1 = mcontour[(m+1) % mcontour.size()];

                    IfcVector2 isect0, isect1;
                    if (IntersectingLineSegments(n0,n1, m0, m1, isect0, isect1)) {

                        if ((isect0 - n0).SquareLength() > sqlen_epsilon) {
                            ++n;

                            ncontour.insert(ncontour.begin() + n, isect0);
                            skiplist.insert(skiplist.begin() + n, true);
                        }
                        else {
                            skiplist[n] = true;
                        }

                        if ((isect1 - n1).SquareLength() > sqlen_epsilon) {
                            ++n;

                            ncontour.insert(ncontour.begin() + n, isect1);
                            skiplist.insert(skiplist.begin() + n, false);
                        }
                    }
                }
            }
        }
    }
}